

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O0

void __thiscall dg::llvmdg::SDG2Dot::dumpEdges(SDG2Dot *this,ostream *out,DGNode *nd)

{
  bool bVar1;
  edge_iterator os;
  edge_iterator nd_00;
  reference ppDVar2;
  ostream *poVar3;
  ostream *in_RSI;
  DepDGElement *ctrl;
  edge_iterator __end2_2;
  edge_iterator __begin2_2;
  edges_range *__range2_2;
  DepDGElement *def;
  edge_iterator __end2_1;
  edge_iterator __begin2_1;
  edges_range *__range2_1;
  DepDGElement *use;
  edge_iterator __end2;
  edge_iterator __begin2;
  edges_range *__range2;
  DepDGElement *in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<dg::sdg::DepDGElement_*> *in_stack_ffffffffffffff70;
  DepDGElement *this_00;
  _Self in_stack_ffffffffffffff78;
  _Self in_stack_ffffffffffffff80;
  EdgesContainer<dg::sdg::DepDGElement,_4U> *local_78;
  EdgesContainer<dg::sdg::DepDGElement,_4U> **local_70;
  DepDGElement *local_68;
  _Self local_60;
  _Self local_58;
  EdgesContainer<dg::sdg::DepDGElement,_4U> *local_50;
  EdgesContainer<dg::sdg::DepDGElement,_4U> **local_48;
  DepDGElement *local_40;
  _Self local_38;
  _Self local_30;
  EdgesContainer<dg::sdg::DepDGElement,_4U> *local_28;
  EdgesContainer<dg::sdg::DepDGElement,_4U> **local_20;
  ostream *local_10;
  
  local_10 = in_RSI;
  local_28 = (EdgesContainer<dg::sdg::DepDGElement,_4U> *)
             sdg::DepDGElement::uses(in_stack_ffffffffffffff68);
  local_20 = &local_28;
  local_30._M_node =
       (_Base_ptr)sdg::DepDGElement::edges_range::begin((edges_range *)in_stack_ffffffffffffff68);
  local_38._M_node =
       (_Base_ptr)sdg::DepDGElement::edges_range::end((edges_range *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppDVar2 = std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator*
                        ((_Rb_tree_const_iterator<dg::sdg::DepDGElement_*> *)0x17c558);
    local_40 = *ppDVar2;
    std::operator<<(local_10,"    ");
    poVar3 = operator<<((ostream *)in_stack_ffffffffffffff80._M_node,
                        (DGElement *)in_stack_ffffffffffffff78._M_node);
    std::operator<<(poVar3," -> ");
    poVar3 = operator<<((ostream *)in_stack_ffffffffffffff80._M_node,
                        (DGElement *)in_stack_ffffffffffffff78._M_node);
    std::operator<<(poVar3,"[style=\"dashed\"]\n");
    std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator++(in_stack_ffffffffffffff70);
  }
  local_50 = (EdgesContainer<dg::sdg::DepDGElement,_4U> *)
             sdg::DepDGElement::memdep(in_stack_ffffffffffffff68);
  local_48 = &local_50;
  local_58._M_node =
       (_Base_ptr)sdg::DepDGElement::edges_range::begin((edges_range *)in_stack_ffffffffffffff68);
  local_60._M_node =
       (_Base_ptr)sdg::DepDGElement::edges_range::end((edges_range *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    ppDVar2 = std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator*
                        ((_Rb_tree_const_iterator<dg::sdg::DepDGElement_*> *)0x17c617);
    local_68 = *ppDVar2;
    std::operator<<(local_10,"    ");
    poVar3 = operator<<((ostream *)in_stack_ffffffffffffff80._M_node,
                        (DGElement *)in_stack_ffffffffffffff78._M_node);
    std::operator<<(poVar3," -> ");
    poVar3 = operator<<((ostream *)in_stack_ffffffffffffff80._M_node,
                        (DGElement *)in_stack_ffffffffffffff78._M_node);
    std::operator<<(poVar3,"[color=red]\n");
    std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator++(in_stack_ffffffffffffff70);
  }
  local_78 = (EdgesContainer<dg::sdg::DepDGElement,_4U> *)
             sdg::DepDGElement::controls(in_stack_ffffffffffffff68);
  local_70 = &local_78;
  os = sdg::DepDGElement::edges_range::begin((edges_range *)in_stack_ffffffffffffff68);
  nd_00 = sdg::DepDGElement::edges_range::end((edges_range *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff80,(_Self *)&stack0xffffffffffffff78);
    if (!bVar1) break;
    ppDVar2 = std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator*
                        ((_Rb_tree_const_iterator<dg::sdg::DepDGElement_*> *)0x17c6d6);
    this_00 = *ppDVar2;
    std::operator<<(local_10,"    ");
    poVar3 = operator<<((ostream *)os._M_node,(DGElement *)nd_00._M_node);
    std::operator<<(poVar3," -> ");
    poVar3 = operator<<((ostream *)os._M_node,(DGElement *)nd_00._M_node);
    std::operator<<(poVar3,"[color=blue]\n");
    std::_Rb_tree_const_iterator<dg::sdg::DepDGElement_*>::operator++
              ((_Rb_tree_const_iterator<dg::sdg::DepDGElement_*> *)this_00);
  }
  return;
}

Assistant:

void dumpEdges(std::ostream &out, sdg::DGNode &nd) const {
        for (auto *use : nd.uses()) {
            out << "    " << nd << " -> " << *use << "[style=\"dashed\"]\n";
        }
        for (auto *def : nd.memdep()) {
            out << "    " << *def << " -> " << nd << "[color=red]\n";
        }
        for (auto *ctrl : nd.controls()) {
            out << "    " << nd << " -> " << *ctrl << "[color=blue]\n";
        }
    }